

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymLocal::gen_code(CTcSymLocal *this,int discard)

{
  int iVar1;
  CTcCodeStream **__n;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  CTcSymLocalBase *in_RDI;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  CTcCodeStream *in_stack_ffffffffffffffe0;
  
  if (in_ESI == 0) {
    if ((*(ushort *)&in_RDI->field_0x64 >> 4 & 1) == 0) {
      in_stack_ffffffffffffffdc = CTcSymLocalBase::get_var_num(in_RDI);
      CTcSymLocalBase::is_param(in_RDI);
      s_gen_code_getlcl(0,0x283fbc);
    }
    else if ((in_RDI->ctx_var_num_ < 0x100) &&
            (iVar1 = CTcSymLocalBase::get_ctx_arr_idx
                               ((CTcSymLocalBase *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
            iVar1 < 0x100)) {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      __n = &G_cs;
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)in_RDI->ctx_var_num_,__buf,0x402388);
      in_stack_ffffffffffffffe0 = G_cs;
      iVar1 = CTcSymLocalBase::get_ctx_arr_idx
                        ((CTcSymLocalBase *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      CTcDataStream::write
                (&in_stack_ffffffffffffffe0->super_CTcDataStream,(int)(char)iVar1,__buf_00,
                 (size_t)__n);
      CTcGenTarg::note_push((CTcGenTarg *)0x283f51);
    }
    else {
      s_gen_code_getlcl(0,0x283f62);
      CTcSymLocalBase::get_ctx_arr_idx
                ((CTcSymLocalBase *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      CTPNConst::s_gen_code_int(0x283f74);
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcGenTarg::note_pop((CTcGenTarg *)0x283f97);
    }
  }
  CTcSymLocalBase::set_val_used
            ((CTcSymLocalBase *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void CTcSymLocal::gen_code(int discard)
{
    /* generate code to push the local, if we're not discarding it */
    if (!discard)
    {
        /* 
         *   generate as a context local if required, otherwise as an
         *   ordinary local variable 
         */
        if (is_ctx_local_)
        {
            /* generate the context array lookup */
            if (ctx_var_num_ <= 255 && get_ctx_arr_idx() <= 255)
            {
                /* we can do this whole operation with one instruction */
                G_cg->write_op(OPC_IDXLCL1INT8);
                G_cs->write((uchar)ctx_var_num_);
                G_cs->write((uchar)get_ctx_arr_idx());

                /* this pushes one value */
                G_cg->note_push();
            }
            else
            {
                /* get our context array */
                s_gen_code_getlcl(ctx_var_num_, FALSE);
                
                /* get our value from the context array */
                CTPNConst::s_gen_code_int(get_ctx_arr_idx());
                G_cg->write_op(OPC_INDEX);
                
                /* the INDEX operation removes two values and pushes one */
                G_cg->note_pop();
            }
        }
        else
        {
            /* generate as an ordinary local */
            s_gen_code_getlcl(get_var_num(), is_param());
        }
    }

    /* 
     *   Mark the value as referenced, whether or not we're generating the
     *   code - the value has been logically referenced in the program
     *   even if the result of evaluating it isn't needed.  
     */
    set_val_used(TRUE);
}